

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  leveldb_writeoptions_t *plVar1;
  uchar uVar2;
  int iVar3;
  leveldb_comparator_t *cmp;
  leveldb_env_t *env;
  leveldb_cache_t *c;
  char *pcVar4;
  leveldb_options_t *plVar5;
  leveldb_readoptions_t *plVar6;
  leveldb_filterpolicy_t *plVar7;
  leveldb_writebatch_t *b;
  leveldb_writebatch_t *b_00;
  leveldb_iterator_t *iter;
  size_t keylen;
  size_t vallen;
  leveldb_snapshot_t *snap;
  leveldb_t *db;
  undefined8 uVar8;
  uint uVar9;
  char *err;
  leveldb_writeoptions_t *local_198;
  leveldb_filterpolicy_t *local_190;
  leveldb_readoptions_t *local_188;
  leveldb_options_t *local_180;
  char *local_178;
  leveldb_env_t *local_170;
  leveldb_comparator_t *local_168;
  leveldb_cache_t *local_160;
  size_t limit_len [2];
  char *limit [2];
  size_t start_len [2];
  char *start [2];
  uint64_t sizes [2];
  int pos;
  uint uStack_104;
  char valbuf [100];
  
  err = (char *)0x0;
  iVar3 = leveldb_major_version();
  if (iVar3 < 1) {
    pcVar4 = "leveldb_major_version() >= 1";
    uVar8 = 0x9f;
  }
  else {
    iVar3 = leveldb_minor_version();
    if (iVar3 < 1) {
      pcVar4 = "leveldb_minor_version() >= 1";
      uVar8 = 0xa0;
    }
    else {
      StartPhase("create_objects");
      cmp = leveldb_comparator_create((void *)0x0,CmpDestroy,CmpCompare,CmpName);
      env = leveldb_create_default_env();
      c = leveldb_cache_create_lru(100000);
      pcVar4 = leveldb_env_get_test_directory(env);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "dbname != NULL";
        uVar8 = 0xa7;
      }
      else {
        plVar5 = leveldb_options_create();
        leveldb_options_set_comparator(plVar5,cmp);
        leveldb_options_set_error_if_exists(plVar5,'\x01');
        local_160 = c;
        leveldb_options_set_cache(plVar5,c);
        leveldb_options_set_env(plVar5,env);
        leveldb_options_set_info_log(plVar5,(leveldb_logger_t *)0x0);
        leveldb_options_set_write_buffer_size(plVar5,100000);
        leveldb_options_set_paranoid_checks(plVar5,'\x01');
        leveldb_options_set_max_open_files(plVar5,10);
        leveldb_options_set_block_size(plVar5,0x400);
        leveldb_options_set_block_restart_interval(plVar5,8);
        leveldb_options_set_max_file_size(plVar5,0x300000);
        leveldb_options_set_compression(plVar5,0);
        plVar6 = leveldb_readoptions_create();
        leveldb_readoptions_set_verify_checksums(plVar6,'\x01');
        local_188 = plVar6;
        leveldb_readoptions_set_fill_cache(plVar6,'\0');
        local_198 = leveldb_writeoptions_create();
        leveldb_writeoptions_set_sync(local_198,'\x01');
        StartPhase("destroy");
        leveldb_destroy_db(plVar5,pcVar4,&err);
        Free(&err);
        StartPhase("open_error");
        leveldb_open(plVar5,pcVar4,&err);
        if (err == (char *)0x0) {
          pcVar4 = "err != NULL";
          uVar8 = 0xc4;
        }
        else {
          local_168 = cmp;
          Free(&err);
          StartPhase("leveldb_free");
          leveldb_open(plVar5,pcVar4,&err);
          if (err == (char *)0x0) {
            pcVar4 = "err != NULL";
            uVar8 = 0xc9;
          }
          else {
            leveldb_free(err);
            err = (char *)0x0;
            StartPhase("open");
            leveldb_options_set_create_if_missing(plVar5,'\x01');
            plVar7 = (leveldb_filterpolicy_t *)leveldb_open(plVar5,pcVar4,&err);
            plVar6 = local_188;
            if (err == (char *)0x0) {
              local_180 = plVar5;
              local_178 = pcVar4;
              local_170 = env;
              CheckGet((leveldb_t *)plVar7,local_188,"foo",(char *)0x0);
              StartPhase("put");
              leveldb_put((leveldb_t *)plVar7,local_198,"foo",3,"hello",5,&err);
              if (err == (char *)0x0) {
                CheckGet((leveldb_t *)plVar7,plVar6,"foo","hello");
                StartPhase("compactall");
                leveldb_compact_range((leveldb_t *)plVar7,(char *)0x0,0,(char *)0x0,0);
                CheckGet((leveldb_t *)plVar7,plVar6,"foo","hello");
                StartPhase("compactrange");
                leveldb_compact_range((leveldb_t *)plVar7,"a",1,"z",1);
                CheckGet((leveldb_t *)plVar7,plVar6,"foo","hello");
                StartPhase("writebatch");
                b = leveldb_writebatch_create();
                local_190 = plVar7;
                leveldb_writebatch_put(b,"foo",3,"a",1);
                leveldb_writebatch_clear(b);
                leveldb_writebatch_put(b,"bar",3,"b",1);
                leveldb_writebatch_put(b,"box",3,"c",1);
                b_00 = leveldb_writebatch_create();
                plVar7 = local_190;
                leveldb_writebatch_delete(b_00,"bar",3);
                leveldb_writebatch_append(b,b_00);
                leveldb_writebatch_destroy(b_00);
                plVar1 = local_198;
                leveldb_write((leveldb_t *)plVar7,local_198,b,&err);
                if (err == (char *)0x0) {
                  CheckGet((leveldb_t *)plVar7,plVar6,"foo","hello");
                  CheckGet((leveldb_t *)plVar7,plVar6,"bar",(char *)0x0);
                  CheckGet((leveldb_t *)plVar7,plVar6,"box","c");
                  _pos = (char *)((ulong)uStack_104 << 0x20);
                  leveldb_writebatch_iterate(b,&pos,CheckPut,CheckDel);
                  if (pos == 3) {
                    leveldb_writebatch_destroy(b);
                    StartPhase("iter");
                    iter = leveldb_create_iterator((leveldb_t *)plVar7,plVar6);
                    uVar2 = leveldb_iter_valid(iter);
                    if (uVar2 == '\0') {
                      leveldb_iter_seek_to_first(iter);
                      uVar2 = leveldb_iter_valid(iter);
                      if (uVar2 == '\0') {
                        uVar8 = 0xfe;
                        pcVar4 = "leveldb_iter_valid(iter)";
                      }
                      else {
                        CheckIter(iter,"box","c");
                        leveldb_iter_next(iter);
                        CheckIter(iter,"foo","hello");
                        leveldb_iter_prev(iter);
                        CheckIter(iter,"box","c");
                        leveldb_iter_prev(iter);
                        uVar2 = leveldb_iter_valid(iter);
                        if (uVar2 == '\0') {
                          leveldb_iter_seek_to_last(iter);
                          CheckIter(iter,"foo","hello");
                          leveldb_iter_seek(iter,"b",1);
                          CheckIter(iter,"box","c");
                          leveldb_iter_get_error(iter,&err);
                          if (err == (char *)0x0) {
                            leveldb_iter_destroy(iter);
                            StartPhase("approximate_sizes");
                            start[0] = "a";
                            start[1] = "k00000000000000010000";
                            start_len[0] = 1;
                            start_len[1] = 0x15;
                            limit[0] = "k00000000000000010000";
                            limit[1] = "z";
                            limit_len[0] = 0x15;
                            limit_len[1] = 1;
                            leveldb_writeoptions_set_sync(plVar1,'\0');
                            uVar9 = 0;
                            do {
                              plVar7 = local_190;
                              if (uVar9 == 20000) {
                                leveldb_approximate_sizes
                                          ((leveldb_t *)local_190,2,start,start_len,limit,limit_len,
                                           sizes);
                                plVar5 = local_180;
                                if (sizes[0] == 0) {
                                  uVar8 = 0x123;
                                  pcVar4 = "sizes[0] > 0";
                                  goto LAB_00107ac1;
                                }
                                if (sizes[1] == 0) {
                                  uVar8 = 0x124;
                                  pcVar4 = "sizes[1] > 0";
                                  goto LAB_00107ac1;
                                }
                                StartPhase("property");
                                pcVar4 = leveldb_property_value((leveldb_t *)plVar7,"nosuchprop");
                                if (pcVar4 != (char *)0x0) {
                                  uVar8 = 0x12a;
                                  pcVar4 = "prop == NULL";
                                  goto LAB_00107ac1;
                                }
                                _pos = leveldb_property_value((leveldb_t *)plVar7,"leveldb.stats");
                                if (_pos == (char *)0x0) {
                                  uVar8 = 300;
                                  pcVar4 = "prop != NULL";
                                  goto LAB_00107ac1;
                                }
                                Free((char **)&pos);
                                StartPhase("snapshot");
                                snap = leveldb_create_snapshot((leveldb_t *)plVar7);
                                leveldb_delete((leveldb_t *)plVar7,local_198,"foo",3,&err);
                                plVar6 = local_188;
                                if (err != (char *)0x0) {
                                  uVar8 = 0x135;
                                  pcVar4 = err;
                                  goto LAB_00107ac1;
                                }
                                leveldb_readoptions_set_snapshot(local_188,snap);
                                CheckGet((leveldb_t *)plVar7,plVar6,"foo","hello");
                                leveldb_readoptions_set_snapshot(plVar6,(leveldb_snapshot_t *)0x0);
                                CheckGet((leveldb_t *)plVar7,plVar6,"foo",(char *)0x0);
                                leveldb_release_snapshot((leveldb_t *)plVar7,snap);
                                StartPhase("repair");
                                leveldb_close((leveldb_t *)plVar7);
                                leveldb_options_set_create_if_missing(plVar5,'\0');
                                leveldb_options_set_error_if_exists(plVar5,'\0');
                                pcVar4 = local_178;
                                leveldb_repair_db(plVar5,local_178,&err);
                                if (err != (char *)0x0) {
                                  uVar8 = 0x143;
                                  pcVar4 = err;
                                  goto LAB_00107ac1;
                                }
                                db = leveldb_open(plVar5,pcVar4,&err);
                                plVar6 = local_188;
                                if (err == (char *)0x0) {
                                  CheckGet(db,local_188,"foo",(char *)0x0);
                                  CheckGet(db,plVar6,"bar",(char *)0x0);
                                  CheckGet(db,plVar6,"box","c");
                                  leveldb_options_set_create_if_missing(plVar5,'\x01');
                                  leveldb_options_set_error_if_exists(plVar5,'\x01');
                                  StartPhase("filter");
                                  iVar3 = 2;
                                  goto LAB_001077b3;
                                }
                                uVar8 = 0x145;
                                pcVar4 = err;
                                goto LAB_00107ac1;
                              }
                              snprintf((char *)&pos,100,"k%020d",(ulong)uVar9);
                              snprintf(valbuf,100,"v%020d",(ulong)uVar9);
                              keylen = strlen((char *)&pos);
                              vallen = strlen(valbuf);
                              leveldb_put((leveldb_t *)local_190,local_198,(char *)&pos,keylen,
                                          valbuf,vallen,&err);
                              uVar9 = uVar9 + 1;
                            } while (err == (char *)0x0);
                            uVar8 = 0x120;
                            pcVar4 = err;
                          }
                          else {
                            uVar8 = 0x10b;
                            pcVar4 = err;
                          }
                        }
                        else {
                          uVar8 = 0x105;
                          pcVar4 = "!leveldb_iter_valid(iter)";
                        }
                      }
                    }
                    else {
                      uVar8 = 0xfc;
                      pcVar4 = "!leveldb_iter_valid(iter)";
                    }
                  }
                  else {
                    uVar8 = 0xf5;
                    pcVar4 = "pos == 3";
                  }
                }
                else {
                  uVar8 = 0xee;
                  pcVar4 = err;
                }
              }
              else {
                uVar8 = 0xd5;
                pcVar4 = err;
              }
            }
            else {
              uVar8 = 0xd0;
              pcVar4 = err;
            }
          }
        }
      }
    }
  }
LAB_00107ac1:
  fprintf(_stderr,"%s:%d: %s: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
          uVar8,phase,pcVar4);
  abort();
LAB_001077b3:
  if (iVar3 == 0) {
    StartPhase("cleanup");
    leveldb_close(db);
    leveldb_options_destroy(local_180);
    leveldb_readoptions_destroy(plVar6);
    leveldb_writeoptions_destroy(local_198);
    leveldb_free(local_178);
    leveldb_cache_destroy(local_160);
    leveldb_comparator_destroy(local_168);
    leveldb_env_destroy(local_170);
    fwrite("PASS\n",5,1,_stderr);
    return 0;
  }
  if (err != (char *)0x0) {
    uVar8 = 0x150;
    pcVar4 = err;
    goto LAB_00107ac1;
  }
  if (iVar3 == 2) {
    plVar7 = leveldb_filterpolicy_create
                       ((void *)0x0,FilterDestroy,FilterCreate,FilterKeyMatch,FilterName);
  }
  else {
    plVar7 = leveldb_filterpolicy_create_bloom(10);
  }
  leveldb_close(db);
  pcVar4 = local_178;
  plVar5 = local_180;
  leveldb_destroy_db(local_180,local_178,&err);
  leveldb_options_set_filter_policy(plVar5,plVar7);
  db = leveldb_open(plVar5,pcVar4,&err);
  plVar1 = local_198;
  if (err != (char *)0x0) {
    uVar8 = 0x15e;
    pcVar4 = err;
    goto LAB_00107ac1;
  }
  local_190 = plVar7;
  leveldb_put(db,local_198,"foo",3,"foovalue",8,&err);
  if (err != (char *)0x0) {
    uVar8 = 0x160;
    pcVar4 = err;
    goto LAB_00107ac1;
  }
  leveldb_put(db,plVar1,"bar",3,"barvalue",8,&err);
  if (err != (char *)0x0) {
    uVar8 = 0x162;
    pcVar4 = err;
    goto LAB_00107ac1;
  }
  leveldb_compact_range(db,(char *)0x0,0,(char *)0x0,0);
  plVar6 = local_188;
  fake_filter_result = 0;
  CheckGet(db,local_188,"foo","foovalue");
  CheckGet(db,plVar6,"bar","barvalue");
  if (phase == (char *)0x0) {
    fake_filter_result = 1;
    CheckGet(db,plVar6,"foo",(char *)0x0);
    CheckGet(db,plVar6,"bar",(char *)0x0);
    fake_filter_result = 0;
    CheckGet(db,plVar6,"foo","foovalue");
    CheckGet(db,plVar6,"bar","barvalue");
  }
  leveldb_options_set_filter_policy(local_180,(leveldb_filterpolicy_t *)0x0);
  leveldb_filterpolicy_destroy(local_190);
  iVar3 = iVar3 + -1;
  goto LAB_001077b3;
}

Assistant:

int main(int argc, char** argv) {
  leveldb_t* db;
  leveldb_comparator_t* cmp;
  leveldb_cache_t* cache;
  leveldb_env_t* env;
  leveldb_options_t* options;
  leveldb_readoptions_t* roptions;
  leveldb_writeoptions_t* woptions;
  char* dbname;
  char* err = NULL;
  int run = -1;

  CheckCondition(leveldb_major_version() >= 1);
  CheckCondition(leveldb_minor_version() >= 1);

  StartPhase("create_objects");
  cmp = leveldb_comparator_create(NULL, CmpDestroy, CmpCompare, CmpName);
  env = leveldb_create_default_env();
  cache = leveldb_cache_create_lru(100000);
  dbname = leveldb_env_get_test_directory(env);
  CheckCondition(dbname != NULL);

  options = leveldb_options_create();
  leveldb_options_set_comparator(options, cmp);
  leveldb_options_set_error_if_exists(options, 1);
  leveldb_options_set_cache(options, cache);
  leveldb_options_set_env(options, env);
  leveldb_options_set_info_log(options, NULL);
  leveldb_options_set_write_buffer_size(options, 100000);
  leveldb_options_set_paranoid_checks(options, 1);
  leveldb_options_set_max_open_files(options, 10);
  leveldb_options_set_block_size(options, 1024);
  leveldb_options_set_block_restart_interval(options, 8);
  leveldb_options_set_max_file_size(options, 3 << 20);
  leveldb_options_set_compression(options, leveldb_no_compression);

  roptions = leveldb_readoptions_create();
  leveldb_readoptions_set_verify_checksums(roptions, 1);
  leveldb_readoptions_set_fill_cache(roptions, 0);

  woptions = leveldb_writeoptions_create();
  leveldb_writeoptions_set_sync(woptions, 1);

  StartPhase("destroy");
  leveldb_destroy_db(options, dbname, &err);
  Free(&err);

  StartPhase("open_error");
  db = leveldb_open(options, dbname, &err);
  CheckCondition(err != NULL);
  Free(&err);

  StartPhase("leveldb_free");
  db = leveldb_open(options, dbname, &err);
  CheckCondition(err != NULL);
  leveldb_free(err);
  err = NULL;

  StartPhase("open");
  leveldb_options_set_create_if_missing(options, 1);
  db = leveldb_open(options, dbname, &err);
  CheckNoError(err);
  CheckGet(db, roptions, "foo", NULL);

  StartPhase("put");
  leveldb_put(db, woptions, "foo", 3, "hello", 5, &err);
  CheckNoError(err);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("compactall");
  leveldb_compact_range(db, NULL, 0, NULL, 0);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("compactrange");
  leveldb_compact_range(db, "a", 1, "z", 1);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("writebatch");
  {
    leveldb_writebatch_t* wb = leveldb_writebatch_create();
    leveldb_writebatch_put(wb, "foo", 3, "a", 1);
    leveldb_writebatch_clear(wb);
    leveldb_writebatch_put(wb, "bar", 3, "b", 1);
    leveldb_writebatch_put(wb, "box", 3, "c", 1);

    leveldb_writebatch_t* wb2 = leveldb_writebatch_create();
    leveldb_writebatch_delete(wb2, "bar", 3);
    leveldb_writebatch_append(wb, wb2);
    leveldb_writebatch_destroy(wb2);

    leveldb_write(db, woptions, wb, &err);
    CheckNoError(err);
    CheckGet(db, roptions, "foo", "hello");
    CheckGet(db, roptions, "bar", NULL);
    CheckGet(db, roptions, "box", "c");

    int pos = 0;
    leveldb_writebatch_iterate(wb, &pos, CheckPut, CheckDel);
    CheckCondition(pos == 3);
    leveldb_writebatch_destroy(wb);
  }

  StartPhase("iter");
  {
    leveldb_iterator_t* iter = leveldb_create_iterator(db, roptions);
    CheckCondition(!leveldb_iter_valid(iter));
    leveldb_iter_seek_to_first(iter);
    CheckCondition(leveldb_iter_valid(iter));
    CheckIter(iter, "box", "c");
    leveldb_iter_next(iter);
    CheckIter(iter, "foo", "hello");
    leveldb_iter_prev(iter);
    CheckIter(iter, "box", "c");
    leveldb_iter_prev(iter);
    CheckCondition(!leveldb_iter_valid(iter));
    leveldb_iter_seek_to_last(iter);
    CheckIter(iter, "foo", "hello");
    leveldb_iter_seek(iter, "b", 1);
    CheckIter(iter, "box", "c");
    leveldb_iter_get_error(iter, &err);
    CheckNoError(err);
    leveldb_iter_destroy(iter);
  }

  StartPhase("approximate_sizes");
  {
    int i;
    int n = 20000;
    char keybuf[100];
    char valbuf[100];
    uint64_t sizes[2];
    const char* start[2] = { "a", "k00000000000000010000" };
    size_t start_len[2] = { 1, 21 };
    const char* limit[2] = { "k00000000000000010000", "z" };
    size_t limit_len[2] = { 21, 1 };
    leveldb_writeoptions_set_sync(woptions, 0);
    for (i = 0; i < n; i++) {
      snprintf(keybuf, sizeof(keybuf), "k%020d", i);
      snprintf(valbuf, sizeof(valbuf), "v%020d", i);
      leveldb_put(db, woptions, keybuf, strlen(keybuf), valbuf, strlen(valbuf),
                  &err);
      CheckNoError(err);
    }
    leveldb_approximate_sizes(db, 2, start, start_len, limit, limit_len, sizes);
    CheckCondition(sizes[0] > 0);
    CheckCondition(sizes[1] > 0);
  }

  StartPhase("property");
  {
    char* prop = leveldb_property_value(db, "nosuchprop");
    CheckCondition(prop == NULL);
    prop = leveldb_property_value(db, "leveldb.stats");
    CheckCondition(prop != NULL);
    Free(&prop);
  }

  StartPhase("snapshot");
  {
    const leveldb_snapshot_t* snap;
    snap = leveldb_create_snapshot(db);
    leveldb_delete(db, woptions, "foo", 3, &err);
    CheckNoError(err);
    leveldb_readoptions_set_snapshot(roptions, snap);
    CheckGet(db, roptions, "foo", "hello");
    leveldb_readoptions_set_snapshot(roptions, NULL);
    CheckGet(db, roptions, "foo", NULL);
    leveldb_release_snapshot(db, snap);
  }

  StartPhase("repair");
  {
    leveldb_close(db);
    leveldb_options_set_create_if_missing(options, 0);
    leveldb_options_set_error_if_exists(options, 0);
    leveldb_repair_db(options, dbname, &err);
    CheckNoError(err);
    db = leveldb_open(options, dbname, &err);
    CheckNoError(err);
    CheckGet(db, roptions, "foo", NULL);
    CheckGet(db, roptions, "bar", NULL);
    CheckGet(db, roptions, "box", "c");
    leveldb_options_set_create_if_missing(options, 1);
    leveldb_options_set_error_if_exists(options, 1);
  }

  StartPhase("filter");
  for (run = 0; run < 2; run++) {
    // First run uses custom filter, second run uses bloom filter
    CheckNoError(err);
    leveldb_filterpolicy_t* policy;
    if (run == 0) {
      policy = leveldb_filterpolicy_create(
          NULL, FilterDestroy, FilterCreate, FilterKeyMatch, FilterName);
    } else {
      policy = leveldb_filterpolicy_create_bloom(10);
    }

    // Create new database
    leveldb_close(db);
    leveldb_destroy_db(options, dbname, &err);
    leveldb_options_set_filter_policy(options, policy);
    db = leveldb_open(options, dbname, &err);
    CheckNoError(err);
    leveldb_put(db, woptions, "foo", 3, "foovalue", 8, &err);
    CheckNoError(err);
    leveldb_put(db, woptions, "bar", 3, "barvalue", 8, &err);
    CheckNoError(err);
    leveldb_compact_range(db, NULL, 0, NULL, 0);

    fake_filter_result = 1;
    CheckGet(db, roptions, "foo", "foovalue");
    CheckGet(db, roptions, "bar", "barvalue");
    if (phase == 0) {
      // Must not find value when custom filter returns false
      fake_filter_result = 0;
      CheckGet(db, roptions, "foo", NULL);
      CheckGet(db, roptions, "bar", NULL);
      fake_filter_result = 1;

      CheckGet(db, roptions, "foo", "foovalue");
      CheckGet(db, roptions, "bar", "barvalue");
    }
    leveldb_options_set_filter_policy(options, NULL);
    leveldb_filterpolicy_destroy(policy);
  }

  StartPhase("cleanup");
  leveldb_close(db);
  leveldb_options_destroy(options);
  leveldb_readoptions_destroy(roptions);
  leveldb_writeoptions_destroy(woptions);
  leveldb_free(dbname);
  leveldb_cache_destroy(cache);
  leveldb_comparator_destroy(cmp);
  leveldb_env_destroy(env);

  fprintf(stderr, "PASS\n");
  return 0;
}